

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iteration.h
# Opt level: O1

void __thiscall
wasm::AbstractChildIterator<wasm::ChildIterator>::AbstractChildIterator
          (AbstractChildIterator<wasm::ChildIterator> *this,Expression *parent)

{
  Expression *in_RAX;
  uint uVar1;
  ulong uVar2;
  long lVar3;
  long lVar4;
  Block *cast;
  Expression *local_38;
  
  (this->children).usedFixed = 0;
  (this->children).flexible.
  super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->children).flexible.
  super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->children).flexible.
  super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38 = in_RAX;
  switch(parent->_id) {
  case InvalidId:
  case NumExpressionIds:
    handle_unreachable("unexpected expression type",
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-delegations-fields.def"
                       ,0x103);
  case BlockId:
    uVar1 = (uint)parent[2].type.id;
    if (0 < (int)uVar1) {
      uVar2 = (ulong)(uVar1 & 0x7fffffff);
      lVar4 = uVar2 * 8;
      lVar3 = uVar2 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (parent[2].type.id <= lVar3 - 2U) {
LAB_006b9269:
          __assert_fail("index < usedElements",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                        ,0xbc,
                        "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                       );
        }
        local_38 = (Expression *)(*(long *)(parent + 2) + lVar4);
        SmallVector<wasm::Expression_**,_4UL>::push_back(&this->children,(Expression ***)&local_38);
        lVar3 = lVar3 + -1;
      } while (1 < lVar3);
    }
    break;
  case IfId:
    if (*(long *)(parent + 2) != 0) {
      local_38 = parent + 2;
      SmallVector<wasm::Expression_**,_4UL>::push_back(&this->children,(Expression ***)&local_38);
    }
    local_38 = (Expression *)&parent[1].type;
    SmallVector<wasm::Expression_**,_4UL>::push_back(&this->children,(Expression ***)&local_38);
    local_38 = parent + 1;
    SmallVector<wasm::Expression_**,_4UL>::push_back(&this->children,(Expression ***)&local_38);
    break;
  case LoopId:
    local_38 = parent + 2;
    SmallVector<wasm::Expression_**,_4UL>::push_back(&this->children,(Expression ***)&local_38);
    break;
  case BreakId:
    if (parent[2].type.id != 0) {
      local_38 = (Expression *)&parent[2].type;
      SmallVector<wasm::Expression_**,_4UL>::push_back(&this->children,(Expression ***)&local_38);
    }
    if (*(long *)(parent + 2) != 0) {
      local_38 = parent + 2;
      SmallVector<wasm::Expression_**,_4UL>::push_back(&this->children,(Expression ***)&local_38);
    }
    break;
  case SwitchId:
    local_38 = (Expression *)&parent[4].type;
    SmallVector<wasm::Expression_**,_4UL>::push_back(&this->children,(Expression ***)&local_38);
    if (*(long *)(parent + 4) != 0) {
      local_38 = parent + 4;
      SmallVector<wasm::Expression_**,_4UL>::push_back(&this->children,(Expression ***)&local_38);
    }
    break;
  case CallId:
    uVar1 = (uint)parent[1].type.id;
    if (0 < (int)uVar1) {
      uVar2 = (ulong)(uVar1 & 0x7fffffff);
      lVar4 = uVar2 * 8;
      lVar3 = uVar2 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (parent[1].type.id <= lVar3 - 2U) goto LAB_006b9269;
        local_38 = (Expression *)(*(long *)(parent + 1) + lVar4);
        SmallVector<wasm::Expression_**,_4UL>::push_back(&this->children,(Expression ***)&local_38);
        lVar3 = lVar3 + -1;
      } while (1 < lVar3);
    }
    break;
  case CallIndirectId:
    local_38 = (Expression *)&parent[3].type;
    SmallVector<wasm::Expression_**,_4UL>::push_back(&this->children,(Expression ***)&local_38);
    if (0 < (int)(uint)*(undefined8 *)(parent + 2)) {
      uVar2 = (ulong)((uint)*(undefined8 *)(parent + 2) & 0x7fffffff);
      lVar4 = uVar2 * 8;
      lVar3 = uVar2 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (*(ulong *)(parent + 2) <= lVar3 - 2U) goto LAB_006b9269;
        local_38 = (Expression *)(parent[1].type.id + lVar4);
        SmallVector<wasm::Expression_**,_4UL>::push_back(&this->children,(Expression ***)&local_38);
        lVar3 = lVar3 + -1;
      } while (1 < lVar3);
    }
    break;
  case LocalSetId:
    local_38 = (Expression *)&parent[1].type;
    SmallVector<wasm::Expression_**,_4UL>::push_back(&this->children,(Expression ***)&local_38);
    break;
  case GlobalSetId:
    local_38 = parent + 2;
    SmallVector<wasm::Expression_**,_4UL>::push_back(&this->children,(Expression ***)&local_38);
    break;
  case LoadId:
    local_38 = parent + 3;
    SmallVector<wasm::Expression_**,_4UL>::push_back(&this->children,(Expression ***)&local_38);
    break;
  case StoreId:
    local_38 = (Expression *)&parent[3].type;
    SmallVector<wasm::Expression_**,_4UL>::push_back(&this->children,(Expression ***)&local_38);
    local_38 = parent + 3;
    SmallVector<wasm::Expression_**,_4UL>::push_back(&this->children,(Expression ***)&local_38);
    break;
  case UnaryId:
    local_38 = (Expression *)&parent[1].type;
    SmallVector<wasm::Expression_**,_4UL>::push_back(&this->children,(Expression ***)&local_38);
    break;
  case BinaryId:
    local_38 = parent + 2;
    SmallVector<wasm::Expression_**,_4UL>::push_back(&this->children,(Expression ***)&local_38);
    local_38 = (Expression *)&parent[1].type;
    SmallVector<wasm::Expression_**,_4UL>::push_back(&this->children,(Expression ***)&local_38);
    break;
  case SelectId:
    local_38 = parent + 2;
    SmallVector<wasm::Expression_**,_4UL>::push_back(&this->children,(Expression ***)&local_38);
    local_38 = (Expression *)&parent[1].type;
    SmallVector<wasm::Expression_**,_4UL>::push_back(&this->children,(Expression ***)&local_38);
    local_38 = parent + 1;
    SmallVector<wasm::Expression_**,_4UL>::push_back(&this->children,(Expression ***)&local_38);
    break;
  case DropId:
    local_38 = parent + 1;
    SmallVector<wasm::Expression_**,_4UL>::push_back(&this->children,(Expression ***)&local_38);
    break;
  case ReturnId:
    if (*(long *)(parent + 1) != 0) {
      local_38 = parent + 1;
      SmallVector<wasm::Expression_**,_4UL>::push_back(&this->children,(Expression ***)&local_38);
    }
    break;
  case MemoryGrowId:
    local_38 = parent + 1;
    SmallVector<wasm::Expression_**,_4UL>::push_back(&this->children,(Expression ***)&local_38);
    break;
  case AtomicRMWId:
    local_38 = (Expression *)&parent[2].type;
    SmallVector<wasm::Expression_**,_4UL>::push_back(&this->children,(Expression ***)&local_38);
    local_38 = parent + 2;
    SmallVector<wasm::Expression_**,_4UL>::push_back(&this->children,(Expression ***)&local_38);
    break;
  case AtomicCmpxchgId:
    local_38 = parent + 3;
    SmallVector<wasm::Expression_**,_4UL>::push_back(&this->children,(Expression ***)&local_38);
    local_38 = (Expression *)&parent[2].type;
    SmallVector<wasm::Expression_**,_4UL>::push_back(&this->children,(Expression ***)&local_38);
    local_38 = parent + 2;
    SmallVector<wasm::Expression_**,_4UL>::push_back(&this->children,(Expression ***)&local_38);
    break;
  case AtomicWaitId:
    local_38 = (Expression *)&parent[2].type;
    SmallVector<wasm::Expression_**,_4UL>::push_back(&this->children,(Expression ***)&local_38);
    local_38 = parent + 2;
    SmallVector<wasm::Expression_**,_4UL>::push_back(&this->children,(Expression ***)&local_38);
    local_38 = (Expression *)&parent[1].type;
    SmallVector<wasm::Expression_**,_4UL>::push_back(&this->children,(Expression ***)&local_38);
    break;
  case AtomicNotifyId:
    local_38 = parent + 2;
    SmallVector<wasm::Expression_**,_4UL>::push_back(&this->children,(Expression ***)&local_38);
    local_38 = (Expression *)&parent[1].type;
    SmallVector<wasm::Expression_**,_4UL>::push_back(&this->children,(Expression ***)&local_38);
    break;
  case SIMDExtractId:
    local_38 = (Expression *)&parent[1].type;
    SmallVector<wasm::Expression_**,_4UL>::push_back(&this->children,(Expression ***)&local_38);
    break;
  case SIMDReplaceId:
    local_38 = (Expression *)&parent[2].type;
    SmallVector<wasm::Expression_**,_4UL>::push_back(&this->children,(Expression ***)&local_38);
    local_38 = (Expression *)&parent[1].type;
    SmallVector<wasm::Expression_**,_4UL>::push_back(&this->children,(Expression ***)&local_38);
    break;
  case SIMDShuffleId:
    local_38 = (Expression *)&parent[1].type;
    SmallVector<wasm::Expression_**,_4UL>::push_back(&this->children,(Expression ***)&local_38);
    local_38 = parent + 1;
    SmallVector<wasm::Expression_**,_4UL>::push_back(&this->children,(Expression ***)&local_38);
    break;
  case SIMDTernaryId:
    local_38 = (Expression *)&parent[2].type;
    SmallVector<wasm::Expression_**,_4UL>::push_back(&this->children,(Expression ***)&local_38);
    local_38 = parent + 2;
    SmallVector<wasm::Expression_**,_4UL>::push_back(&this->children,(Expression ***)&local_38);
    local_38 = (Expression *)&parent[1].type;
    SmallVector<wasm::Expression_**,_4UL>::push_back(&this->children,(Expression ***)&local_38);
    break;
  case SIMDShiftId:
    local_38 = parent + 2;
    SmallVector<wasm::Expression_**,_4UL>::push_back(&this->children,(Expression ***)&local_38);
    local_38 = (Expression *)&parent[1].type;
    SmallVector<wasm::Expression_**,_4UL>::push_back(&this->children,(Expression ***)&local_38);
    break;
  case SIMDLoadId:
    local_38 = (Expression *)&parent[2].type;
    SmallVector<wasm::Expression_**,_4UL>::push_back(&this->children,(Expression ***)&local_38);
    break;
  case SIMDLoadStoreLaneId:
    local_38 = (Expression *)&parent[3].type;
    SmallVector<wasm::Expression_**,_4UL>::push_back(&this->children,(Expression ***)&local_38);
    local_38 = parent + 3;
    SmallVector<wasm::Expression_**,_4UL>::push_back(&this->children,(Expression ***)&local_38);
    break;
  case MemoryInitId:
    local_38 = parent + 3;
    SmallVector<wasm::Expression_**,_4UL>::push_back(&this->children,(Expression ***)&local_38);
    local_38 = (Expression *)&parent[2].type;
    SmallVector<wasm::Expression_**,_4UL>::push_back(&this->children,(Expression ***)&local_38);
    local_38 = parent + 2;
    SmallVector<wasm::Expression_**,_4UL>::push_back(&this->children,(Expression ***)&local_38);
    break;
  case MemoryCopyId:
    local_38 = parent + 2;
    SmallVector<wasm::Expression_**,_4UL>::push_back(&this->children,(Expression ***)&local_38);
    local_38 = (Expression *)&parent[1].type;
    SmallVector<wasm::Expression_**,_4UL>::push_back(&this->children,(Expression ***)&local_38);
    local_38 = parent + 1;
    SmallVector<wasm::Expression_**,_4UL>::push_back(&this->children,(Expression ***)&local_38);
    break;
  case MemoryFillId:
    local_38 = parent + 2;
    SmallVector<wasm::Expression_**,_4UL>::push_back(&this->children,(Expression ***)&local_38);
    local_38 = (Expression *)&parent[1].type;
    SmallVector<wasm::Expression_**,_4UL>::push_back(&this->children,(Expression ***)&local_38);
    local_38 = parent + 1;
    SmallVector<wasm::Expression_**,_4UL>::push_back(&this->children,(Expression ***)&local_38);
    break;
  case RefIsNullId:
    local_38 = parent + 1;
    SmallVector<wasm::Expression_**,_4UL>::push_back(&this->children,(Expression ***)&local_38);
    break;
  case RefEqId:
    local_38 = (Expression *)&parent[1].type;
    SmallVector<wasm::Expression_**,_4UL>::push_back(&this->children,(Expression ***)&local_38);
    local_38 = parent + 1;
    SmallVector<wasm::Expression_**,_4UL>::push_back(&this->children,(Expression ***)&local_38);
    break;
  case TableGetId:
    local_38 = parent + 2;
    SmallVector<wasm::Expression_**,_4UL>::push_back(&this->children,(Expression ***)&local_38);
    break;
  case TableSetId:
    local_38 = (Expression *)&parent[2].type;
    SmallVector<wasm::Expression_**,_4UL>::push_back(&this->children,(Expression ***)&local_38);
    local_38 = parent + 2;
    SmallVector<wasm::Expression_**,_4UL>::push_back(&this->children,(Expression ***)&local_38);
    break;
  case TableGrowId:
    local_38 = (Expression *)&parent[2].type;
    SmallVector<wasm::Expression_**,_4UL>::push_back(&this->children,(Expression ***)&local_38);
    local_38 = parent + 2;
    SmallVector<wasm::Expression_**,_4UL>::push_back(&this->children,(Expression ***)&local_38);
    break;
  case TableFillId:
    local_38 = parent + 3;
    SmallVector<wasm::Expression_**,_4UL>::push_back(&this->children,(Expression ***)&local_38);
    local_38 = (Expression *)&parent[2].type;
    SmallVector<wasm::Expression_**,_4UL>::push_back(&this->children,(Expression ***)&local_38);
    local_38 = parent + 2;
    SmallVector<wasm::Expression_**,_4UL>::push_back(&this->children,(Expression ***)&local_38);
    break;
  case TableCopyId:
    local_38 = parent + 2;
    SmallVector<wasm::Expression_**,_4UL>::push_back(&this->children,(Expression ***)&local_38);
    local_38 = (Expression *)&parent[1].type;
    SmallVector<wasm::Expression_**,_4UL>::push_back(&this->children,(Expression ***)&local_38);
    local_38 = parent + 1;
    SmallVector<wasm::Expression_**,_4UL>::push_back(&this->children,(Expression ***)&local_38);
    break;
  case TableInitId:
    local_38 = parent + 3;
    SmallVector<wasm::Expression_**,_4UL>::push_back(&this->children,(Expression ***)&local_38);
    local_38 = (Expression *)&parent[2].type;
    SmallVector<wasm::Expression_**,_4UL>::push_back(&this->children,(Expression ***)&local_38);
    local_38 = parent + 2;
    SmallVector<wasm::Expression_**,_4UL>::push_back(&this->children,(Expression ***)&local_38);
    break;
  case TryId:
    if (0 < (int)(uint)*(undefined8 *)(parent + 5)) {
      uVar2 = (ulong)((uint)*(undefined8 *)(parent + 5) & 0x7fffffff);
      lVar4 = uVar2 * 8;
      lVar3 = uVar2 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (*(ulong *)(parent + 5) <= lVar3 - 2U) goto LAB_006b9269;
        local_38 = (Expression *)(parent[4].type.id + lVar4);
        SmallVector<wasm::Expression_**,_4UL>::push_back(&this->children,(Expression ***)&local_38);
        lVar3 = lVar3 + -1;
      } while (1 < lVar3);
    }
    local_38 = parent + 2;
    SmallVector<wasm::Expression_**,_4UL>::push_back(&this->children,(Expression ***)&local_38);
    break;
  case TryTableId:
    local_38 = parent + 1;
    SmallVector<wasm::Expression_**,_4UL>::push_back(&this->children,(Expression ***)&local_38);
    break;
  case ThrowId:
    uVar1 = (uint)parent[2].type.id;
    if (0 < (int)uVar1) {
      uVar2 = (ulong)(uVar1 & 0x7fffffff);
      lVar4 = uVar2 * 8;
      lVar3 = uVar2 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (parent[2].type.id <= lVar3 - 2U) goto LAB_006b9269;
        local_38 = (Expression *)(*(long *)(parent + 2) + lVar4);
        SmallVector<wasm::Expression_**,_4UL>::push_back(&this->children,(Expression ***)&local_38);
        lVar3 = lVar3 + -1;
      } while (1 < lVar3);
    }
    break;
  case ThrowRefId:
    local_38 = parent + 1;
    SmallVector<wasm::Expression_**,_4UL>::push_back(&this->children,(Expression ***)&local_38);
    break;
  case TupleMakeId:
    uVar1 = (uint)parent[1].type.id;
    if (0 < (int)uVar1) {
      uVar2 = (ulong)(uVar1 & 0x7fffffff);
      lVar4 = uVar2 * 8;
      lVar3 = uVar2 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (parent[1].type.id <= lVar3 - 2U) goto LAB_006b9269;
        local_38 = (Expression *)(*(long *)(parent + 1) + lVar4);
        SmallVector<wasm::Expression_**,_4UL>::push_back(&this->children,(Expression ***)&local_38);
        lVar3 = lVar3 + -1;
      } while (1 < lVar3);
    }
    break;
  case TupleExtractId:
    local_38 = parent + 1;
    SmallVector<wasm::Expression_**,_4UL>::push_back(&this->children,(Expression ***)&local_38);
    break;
  case RefI31Id:
    local_38 = parent + 1;
    SmallVector<wasm::Expression_**,_4UL>::push_back(&this->children,(Expression ***)&local_38);
    break;
  case I31GetId:
    local_38 = parent + 1;
    SmallVector<wasm::Expression_**,_4UL>::push_back(&this->children,(Expression ***)&local_38);
    break;
  case CallRefId:
    local_38 = parent + 3;
    SmallVector<wasm::Expression_**,_4UL>::push_back(&this->children,(Expression ***)&local_38);
    uVar1 = (uint)parent[1].type.id;
    if (0 < (int)uVar1) {
      uVar2 = (ulong)(uVar1 & 0x7fffffff);
      lVar4 = uVar2 * 8;
      lVar3 = uVar2 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (parent[1].type.id <= lVar3 - 2U) goto LAB_006b9269;
        local_38 = (Expression *)(*(long *)(parent + 1) + lVar4);
        SmallVector<wasm::Expression_**,_4UL>::push_back(&this->children,(Expression ***)&local_38);
        lVar3 = lVar3 + -1;
      } while (1 < lVar3);
    }
    break;
  case RefTestId:
    local_38 = parent + 1;
    SmallVector<wasm::Expression_**,_4UL>::push_back(&this->children,(Expression ***)&local_38);
    break;
  case RefCastId:
    local_38 = parent + 1;
    SmallVector<wasm::Expression_**,_4UL>::push_back(&this->children,(Expression ***)&local_38);
    break;
  case BrOnId:
    local_38 = (Expression *)&parent[2].type;
    SmallVector<wasm::Expression_**,_4UL>::push_back(&this->children,(Expression ***)&local_38);
    break;
  case StructNewId:
    uVar1 = (uint)parent[1].type.id;
    if (0 < (int)uVar1) {
      uVar2 = (ulong)(uVar1 & 0x7fffffff);
      lVar4 = uVar2 * 8;
      lVar3 = uVar2 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (parent[1].type.id <= lVar3 - 2U) goto LAB_006b9269;
        local_38 = (Expression *)(*(long *)(parent + 1) + lVar4);
        SmallVector<wasm::Expression_**,_4UL>::push_back(&this->children,(Expression ***)&local_38);
        lVar3 = lVar3 + -1;
      } while (1 < lVar3);
    }
    break;
  case StructGetId:
    local_38 = (Expression *)&parent[1].type;
    SmallVector<wasm::Expression_**,_4UL>::push_back(&this->children,(Expression ***)&local_38);
    break;
  case StructSetId:
    local_38 = parent + 2;
    SmallVector<wasm::Expression_**,_4UL>::push_back(&this->children,(Expression ***)&local_38);
    local_38 = (Expression *)&parent[1].type;
    SmallVector<wasm::Expression_**,_4UL>::push_back(&this->children,(Expression ***)&local_38);
    break;
  case StructRMWId:
    local_38 = parent + 2;
    SmallVector<wasm::Expression_**,_4UL>::push_back(&this->children,(Expression ***)&local_38);
    local_38 = (Expression *)&parent[1].type;
    SmallVector<wasm::Expression_**,_4UL>::push_back(&this->children,(Expression ***)&local_38);
    break;
  case StructCmpxchgId:
    local_38 = (Expression *)&parent[2].type;
    SmallVector<wasm::Expression_**,_4UL>::push_back(&this->children,(Expression ***)&local_38);
    local_38 = parent + 2;
    SmallVector<wasm::Expression_**,_4UL>::push_back(&this->children,(Expression ***)&local_38);
    local_38 = (Expression *)&parent[1].type;
    SmallVector<wasm::Expression_**,_4UL>::push_back(&this->children,(Expression ***)&local_38);
    break;
  case ArrayNewId:
    local_38 = (Expression *)&parent[1].type;
    SmallVector<wasm::Expression_**,_4UL>::push_back(&this->children,(Expression ***)&local_38);
    if (*(long *)(parent + 1) != 0) {
      local_38 = parent + 1;
      SmallVector<wasm::Expression_**,_4UL>::push_back(&this->children,(Expression ***)&local_38);
    }
    break;
  case ArrayNewDataId:
    local_38 = (Expression *)&parent[2].type;
    SmallVector<wasm::Expression_**,_4UL>::push_back(&this->children,(Expression ***)&local_38);
    local_38 = parent + 2;
    SmallVector<wasm::Expression_**,_4UL>::push_back(&this->children,(Expression ***)&local_38);
    break;
  case ArrayNewElemId:
    local_38 = (Expression *)&parent[2].type;
    SmallVector<wasm::Expression_**,_4UL>::push_back(&this->children,(Expression ***)&local_38);
    local_38 = parent + 2;
    SmallVector<wasm::Expression_**,_4UL>::push_back(&this->children,(Expression ***)&local_38);
    break;
  case ArrayNewFixedId:
    uVar1 = (uint)parent[1].type.id;
    if (0 < (int)uVar1) {
      uVar2 = (ulong)(uVar1 & 0x7fffffff);
      lVar4 = uVar2 * 8;
      lVar3 = uVar2 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (parent[1].type.id <= lVar3 - 2U) goto LAB_006b9269;
        local_38 = (Expression *)(*(long *)(parent + 1) + lVar4);
        SmallVector<wasm::Expression_**,_4UL>::push_back(&this->children,(Expression ***)&local_38);
        lVar3 = lVar3 + -1;
      } while (1 < lVar3);
    }
    break;
  case ArrayGetId:
    local_38 = (Expression *)&parent[1].type;
    SmallVector<wasm::Expression_**,_4UL>::push_back(&this->children,(Expression ***)&local_38);
    local_38 = parent + 1;
    SmallVector<wasm::Expression_**,_4UL>::push_back(&this->children,(Expression ***)&local_38);
    break;
  case ArraySetId:
    local_38 = parent + 2;
    SmallVector<wasm::Expression_**,_4UL>::push_back(&this->children,(Expression ***)&local_38);
    local_38 = (Expression *)&parent[1].type;
    SmallVector<wasm::Expression_**,_4UL>::push_back(&this->children,(Expression ***)&local_38);
    local_38 = parent + 1;
    SmallVector<wasm::Expression_**,_4UL>::push_back(&this->children,(Expression ***)&local_38);
    break;
  case ArrayLenId:
    local_38 = parent + 1;
    SmallVector<wasm::Expression_**,_4UL>::push_back(&this->children,(Expression ***)&local_38);
    break;
  case ArrayCopyId:
    local_38 = parent + 3;
    SmallVector<wasm::Expression_**,_4UL>::push_back(&this->children,(Expression ***)&local_38);
    local_38 = (Expression *)&parent[2].type;
    SmallVector<wasm::Expression_**,_4UL>::push_back(&this->children,(Expression ***)&local_38);
    local_38 = parent + 2;
    SmallVector<wasm::Expression_**,_4UL>::push_back(&this->children,(Expression ***)&local_38);
    local_38 = (Expression *)&parent[1].type;
    SmallVector<wasm::Expression_**,_4UL>::push_back(&this->children,(Expression ***)&local_38);
    local_38 = parent + 1;
    SmallVector<wasm::Expression_**,_4UL>::push_back(&this->children,(Expression ***)&local_38);
    break;
  case ArrayFillId:
    local_38 = (Expression *)&parent[2].type;
    SmallVector<wasm::Expression_**,_4UL>::push_back(&this->children,(Expression ***)&local_38);
    local_38 = parent + 2;
    SmallVector<wasm::Expression_**,_4UL>::push_back(&this->children,(Expression ***)&local_38);
    local_38 = (Expression *)&parent[1].type;
    SmallVector<wasm::Expression_**,_4UL>::push_back(&this->children,(Expression ***)&local_38);
    local_38 = parent + 1;
    SmallVector<wasm::Expression_**,_4UL>::push_back(&this->children,(Expression ***)&local_38);
    break;
  case ArrayInitDataId:
    local_38 = (Expression *)&parent[3].type;
    SmallVector<wasm::Expression_**,_4UL>::push_back(&this->children,(Expression ***)&local_38);
    local_38 = parent + 3;
    SmallVector<wasm::Expression_**,_4UL>::push_back(&this->children,(Expression ***)&local_38);
    local_38 = (Expression *)&parent[2].type;
    SmallVector<wasm::Expression_**,_4UL>::push_back(&this->children,(Expression ***)&local_38);
    local_38 = parent + 2;
    SmallVector<wasm::Expression_**,_4UL>::push_back(&this->children,(Expression ***)&local_38);
    break;
  case ArrayInitElemId:
    local_38 = (Expression *)&parent[3].type;
    SmallVector<wasm::Expression_**,_4UL>::push_back(&this->children,(Expression ***)&local_38);
    local_38 = parent + 3;
    SmallVector<wasm::Expression_**,_4UL>::push_back(&this->children,(Expression ***)&local_38);
    local_38 = (Expression *)&parent[2].type;
    SmallVector<wasm::Expression_**,_4UL>::push_back(&this->children,(Expression ***)&local_38);
    local_38 = parent + 2;
    SmallVector<wasm::Expression_**,_4UL>::push_back(&this->children,(Expression ***)&local_38);
    break;
  case RefAsId:
    local_38 = (Expression *)&parent[1].type;
    SmallVector<wasm::Expression_**,_4UL>::push_back(&this->children,(Expression ***)&local_38);
    break;
  case StringNewId:
    if (parent[2].type.id != 0) {
      local_38 = (Expression *)&parent[2].type;
      SmallVector<wasm::Expression_**,_4UL>::push_back(&this->children,(Expression ***)&local_38);
    }
    if (*(long *)(parent + 2) != 0) {
      local_38 = parent + 2;
      SmallVector<wasm::Expression_**,_4UL>::push_back(&this->children,(Expression ***)&local_38);
    }
    local_38 = (Expression *)&parent[1].type;
    SmallVector<wasm::Expression_**,_4UL>::push_back(&this->children,(Expression ***)&local_38);
    break;
  case StringMeasureId:
    local_38 = (Expression *)&parent[1].type;
    SmallVector<wasm::Expression_**,_4UL>::push_back(&this->children,(Expression ***)&local_38);
    break;
  case StringEncodeId:
    if (parent[2].type.id != 0) {
      local_38 = (Expression *)&parent[2].type;
      SmallVector<wasm::Expression_**,_4UL>::push_back(&this->children,(Expression ***)&local_38);
    }
    local_38 = parent + 2;
    SmallVector<wasm::Expression_**,_4UL>::push_back(&this->children,(Expression ***)&local_38);
    local_38 = (Expression *)&parent[1].type;
    SmallVector<wasm::Expression_**,_4UL>::push_back(&this->children,(Expression ***)&local_38);
    break;
  case StringConcatId:
    local_38 = (Expression *)&parent[1].type;
    SmallVector<wasm::Expression_**,_4UL>::push_back(&this->children,(Expression ***)&local_38);
    local_38 = parent + 1;
    SmallVector<wasm::Expression_**,_4UL>::push_back(&this->children,(Expression ***)&local_38);
    break;
  case StringEqId:
    local_38 = parent + 2;
    SmallVector<wasm::Expression_**,_4UL>::push_back(&this->children,(Expression ***)&local_38);
    local_38 = (Expression *)&parent[1].type;
    SmallVector<wasm::Expression_**,_4UL>::push_back(&this->children,(Expression ***)&local_38);
    break;
  case StringWTF16GetId:
    local_38 = (Expression *)&parent[1].type;
    SmallVector<wasm::Expression_**,_4UL>::push_back(&this->children,(Expression ***)&local_38);
    local_38 = parent + 1;
    SmallVector<wasm::Expression_**,_4UL>::push_back(&this->children,(Expression ***)&local_38);
    break;
  case StringSliceWTFId:
    local_38 = parent + 2;
    SmallVector<wasm::Expression_**,_4UL>::push_back(&this->children,(Expression ***)&local_38);
    local_38 = (Expression *)&parent[1].type;
    SmallVector<wasm::Expression_**,_4UL>::push_back(&this->children,(Expression ***)&local_38);
    local_38 = parent + 1;
    SmallVector<wasm::Expression_**,_4UL>::push_back(&this->children,(Expression ***)&local_38);
    break;
  case ContNewId:
    local_38 = parent + 1;
    SmallVector<wasm::Expression_**,_4UL>::push_back(&this->children,(Expression ***)&local_38);
    break;
  case ContBindId:
    local_38 = parent + 3;
    SmallVector<wasm::Expression_**,_4UL>::push_back(&this->children,(Expression ***)&local_38);
    uVar1 = (uint)parent[1].type.id;
    if (0 < (int)uVar1) {
      uVar2 = (ulong)(uVar1 & 0x7fffffff);
      lVar4 = uVar2 * 8;
      lVar3 = uVar2 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (parent[1].type.id <= lVar3 - 2U) goto LAB_006b9269;
        local_38 = (Expression *)(*(long *)(parent + 1) + lVar4);
        SmallVector<wasm::Expression_**,_4UL>::push_back(&this->children,(Expression ***)&local_38);
        lVar3 = lVar3 + -1;
      } while (1 < lVar3);
    }
    break;
  case SuspendId:
    uVar1 = (uint)parent[2].type.id;
    if (0 < (int)uVar1) {
      uVar2 = (ulong)(uVar1 & 0x7fffffff);
      lVar4 = uVar2 * 8;
      lVar3 = uVar2 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (parent[2].type.id <= lVar3 - 2U) goto LAB_006b9269;
        local_38 = (Expression *)(*(long *)(parent + 2) + lVar4);
        SmallVector<wasm::Expression_**,_4UL>::push_back(&this->children,(Expression ***)&local_38);
        lVar3 = lVar3 + -1;
      } while (1 < lVar3);
    }
    break;
  case ResumeId:
    local_38 = parent + 7;
    SmallVector<wasm::Expression_**,_4UL>::push_back(&this->children,(Expression ***)&local_38);
    uVar1 = (uint)parent[5].type.id;
    if (0 < (int)uVar1) {
      uVar2 = (ulong)(uVar1 & 0x7fffffff);
      lVar4 = uVar2 * 8;
      lVar3 = uVar2 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (parent[5].type.id <= lVar3 - 2U) goto LAB_006b9269;
        local_38 = (Expression *)(*(long *)(parent + 5) + lVar4);
        SmallVector<wasm::Expression_**,_4UL>::push_back(&this->children,(Expression ***)&local_38);
        lVar3 = lVar3 + -1;
      } while (1 < lVar3);
    }
    break;
  case ResumeThrowId:
    local_38 = parent + 8;
    SmallVector<wasm::Expression_**,_4UL>::push_back(&this->children,(Expression ***)&local_38);
    uVar1 = (uint)parent[6].type.id;
    if (0 < (int)uVar1) {
      uVar2 = (ulong)(uVar1 & 0x7fffffff);
      lVar4 = uVar2 * 8;
      lVar3 = uVar2 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (parent[6].type.id <= lVar3 - 2U) goto LAB_006b9269;
        local_38 = (Expression *)(*(long *)(parent + 6) + lVar4);
        SmallVector<wasm::Expression_**,_4UL>::push_back(&this->children,(Expression ***)&local_38);
        lVar3 = lVar3 + -1;
      } while (1 < lVar3);
    }
    break;
  case StackSwitchId:
    local_38 = parent + 4;
    SmallVector<wasm::Expression_**,_4UL>::push_back(&this->children,(Expression ***)&local_38);
    uVar1 = (uint)parent[2].type.id;
    if (0 < (int)uVar1) {
      uVar2 = (ulong)(uVar1 & 0x7fffffff);
      lVar4 = uVar2 * 8;
      lVar3 = uVar2 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (parent[2].type.id <= lVar3 - 2U) goto LAB_006b9269;
        local_38 = (Expression *)(*(long *)(parent + 2) + lVar4);
        SmallVector<wasm::Expression_**,_4UL>::push_back(&this->children,(Expression ***)&local_38);
        lVar3 = lVar3 + -1;
      } while (1 < lVar3);
    }
  }
  return;
}

Assistant:

AbstractChildIterator(Expression* parent) {
    auto* self = (Specific*)this;

#define DELEGATE_ID parent->_id

#define DELEGATE_START(id) [[maybe_unused]] auto* cast = parent->cast<id>();

#define DELEGATE_GET_FIELD(id, field) cast->field

#define DELEGATE_FIELD_CHILD(id, field) self->addChild(parent, &cast->field);

#define DELEGATE_FIELD_OPTIONAL_CHILD(id, field)                               \
  if (cast->field) {                                                           \
    self->addChild(parent, &cast->field);                                      \
  }

#define DELEGATE_FIELD_INT(id, field)
#define DELEGATE_FIELD_LITERAL(id, field)
#define DELEGATE_FIELD_NAME(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_DEF(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_USE(id, field)
#define DELEGATE_FIELD_TYPE(id, field)
#define DELEGATE_FIELD_HEAPTYPE(id, field)
#define DELEGATE_FIELD_ADDRESS(id, field)

#include "wasm-delegations-fields.def"
  }